

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void * myReallocFunc(void *mem,size_t size)

{
  int iVar1;
  long lVar2;
  size_t oldsize;
  void *ret;
  size_t size_local;
  void *mem_local;
  
  lVar2 = xmlMemSize(mem);
  iVar1 = xmlMemUsed();
  if ((ulong)(long)xmllintMaxmem < ((long)iVar1 + size) - lVar2) {
    xmllintMaxmemReached = 1;
    xmllintOom = 1;
    mem_local = (void *)0x0;
  }
  else {
    mem_local = (void *)xmlMemRealloc(mem,size);
    if (mem_local == (void *)0x0) {
      xmllintOom = 1;
    }
  }
  return mem_local;
}

Assistant:

static void *
myReallocFunc(void *mem, size_t size) {
    void *ret;
    size_t oldsize = xmlMemSize(mem);

    if (xmlMemUsed() + size - oldsize > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemRealloc(mem, size);
    if (ret == NULL)
        xmllintOom = 1;

    return(ret);
}